

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall wasm::WATParser::Lexer::skipSpace(Lexer *this)

{
  bool bVar1;
  size_t sVar2;
  char *in_RCX;
  string_view sVar3;
  basic_string_view<char,_std::char_traits<char>_> str;
  string_view in;
  string_view in_00;
  string_view in_01;
  string_view sv;
  string_view sv_00;
  string_view sv_01;
  string_view sv_02;
  size_type sStack_130;
  undefined1 auStack_120 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> basic;
  value_type local_f8;
  undefined1 local_d8;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *local_d0;
  undefined1 auStack_c8 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  char local_90;
  char local_88;
  undefined1 local_80 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> ctx;
  char *local_60;
  size_t sStack_58;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  size_type local_40;
  long local_38;
  
  local_d0 = &this->annotations;
  do {
    while( true ) {
      _local_80 = next(this);
      local_50._M_len = 0;
      local_50._M_str = (char *)0x0;
      sStack_58 = 0;
      ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
      _M_payload._M_value.span._M_str = (char *)0x0;
      stack0xffffffffffffff98 = (string_view)ZEXT816(0);
      local_40 = 0;
      sVar3._M_str = ";;@";
      sVar3._M_len = 3;
      bVar1 = anon_unknown_0::LexCtx::takePrefix((LexCtx *)local_80,sVar3);
      if (bVar1) break;
      sv._M_str = "(@";
      sv._M_len = 2;
      bVar1 = anon_unknown_0::LexCtx::takePrefix((LexCtx *)local_80,sv);
      if (!bVar1) goto LAB_00c00917;
      join_0x00000010_0x00000000_ = anon_unknown_0::LexCtx::next((LexCtx *)local_80);
      bVar1 = false;
      while( true ) {
        sVar3 = anon_unknown_0::LexCtx::next((LexCtx *)local_80);
        in._M_len = sVar3._M_str;
        in._M_str = in_RCX;
        anon_unknown_0::idchar
                  ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)auStack_c8,
                   (anon_unknown_0 *)sVar3._M_len,in);
        if (lexed.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
            _M_payload._8_1_ != '\x01') break;
        sStack_58 = sStack_58 + 1;
        ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
        _M_payload._M_value.span._M_str =
             ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
             ._M_payload.
             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
             _M_payload._M_value.span._M_str + 1;
        bVar1 = true;
      }
      if (bVar1) {
        anon_unknown_0::LexAnnotationCtx::startContents((LexAnnotationCtx *)local_80);
        local_38 = 1;
LAB_00c009fd:
        do {
          if (local_80 ==
              (undefined1  [8])
              ctx.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
              _M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
              _M_payload._M_value.span._M_str) break;
          sVar3 = anon_unknown_0::LexCtx::next((LexCtx *)local_80);
          anon_unknown_0::space
                    ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)auStack_c8,sVar3
                    );
          if (lexed.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
              _M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
              _M_payload._8_1_ != '\x01') {
            sVar3 = anon_unknown_0::LexCtx::next((LexCtx *)local_80);
            anon_unknown_0::keyword
                      ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)auStack_c8,
                       sVar3);
            if (lexed.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
                _M_payload.
                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                _M_payload._8_1_ != '\x01') {
              sVar3 = anon_unknown_0::LexCtx::next((LexCtx *)local_80);
              anon_unknown_0::integer
                        ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)
                         auStack_c8,sVar3);
              if ((char)local_a8._M_len != '\x01') {
                sVar3 = anon_unknown_0::LexCtx::next((LexCtx *)local_80);
                anon_unknown_0::float_
                          ((optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult> *)
                           auStack_c8,sVar3);
                if ((char)local_a8._M_str != '\x01') {
                  sVar3 = anon_unknown_0::LexCtx::next((LexCtx *)local_80);
                  anon_unknown_0::str((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                                       *)auStack_c8,sVar3);
                  if (local_90 == '\x01') {
                    local_40 = local_40 + (long)auStack_c8;
                    ctx.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                    _M_payload._M_value.span._M_str =
                         ctx.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                         ._M_payload._M_value.span._M_str + (long)auStack_c8;
                    std::
                    _Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                    ::~_Optional_base((_Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                                       *)auStack_c8);
                    goto LAB_00c009fd;
                  }
                  std::
                  _Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                  ::~_Optional_base((_Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                                     *)auStack_c8);
                  sVar3 = anon_unknown_0::LexCtx::next((LexCtx *)local_80);
                  in_00._M_len = sVar3._M_str;
                  in_00._M_str = in_RCX;
                  anon_unknown_0::ident
                            ((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)
                             auStack_c8,(anon_unknown_0 *)sVar3._M_len,in_00);
                  if (local_88 == '\x01') {
                    local_40 = local_40 + (long)auStack_c8;
                    ctx.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                    _M_payload._M_value.span._M_str =
                         ctx.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                         ._M_payload._M_value.span._M_str + (long)auStack_c8;
                    std::
                    _Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                    ::~_Optional_base((_Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                                       *)auStack_c8);
                    goto LAB_00c009fd;
                  }
                  std::
                  _Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                  ::~_Optional_base((_Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                                     *)auStack_c8);
                  sv_00._M_str = "(@";
                  sv_00._M_len = 2;
                  sVar2 = anon_unknown_0::LexCtx::startsWith((LexCtx *)local_80,sv_00);
                  if (sVar2 == 0) {
                    sv_01._M_str = "(";
                    sv_01._M_len = 1;
                    sVar2 = anon_unknown_0::LexCtx::startsWith((LexCtx *)local_80,sv_01);
                    if (sVar2 == 0) {
                      sv_02._M_str = ")";
                      sv_02._M_len = 1;
                      sVar2 = anon_unknown_0::LexCtx::startsWith((LexCtx *)local_80,sv_02);
                      if (sVar2 == 0) break;
                      if (local_38 + -1 == 0) {
                        sStack_130 = 1;
                        goto LAB_00c008bb;
                      }
                      local_40 = local_40 + 1;
                      ctx.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                      ._M_payload._M_value.span._M_str =
                           ctx.
                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                           ._M_payload._M_value.span._M_str + 1;
                      local_38 = local_38 + -1;
                      goto LAB_00c009fd;
                    }
                    local_40 = local_40 + 1;
                    ctx.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                    _M_payload._M_value.span._M_str =
                         ctx.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                         ._M_payload._M_value.span._M_str + 1;
                  }
                  else {
                    local_40 = local_40 + 2;
                    ctx.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                    _M_payload._M_value.span._M_str =
                         ctx.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                         ._M_payload._M_value.span._M_str + 2;
                    bVar1 = false;
                    while( true ) {
                      sVar3 = anon_unknown_0::LexCtx::next((LexCtx *)local_80);
                      in_01._M_len = sVar3._M_str;
                      in_01._M_str = in_RCX;
                      anon_unknown_0::idchar
                                ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)
                                 auStack_c8,(anon_unknown_0 *)sVar3._M_len,in_01);
                      if (lexed.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                          ._M_payload._8_1_ != '\x01') break;
                      local_40 = local_40 + 1;
                      ctx.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                      ._M_payload._M_value.span._M_str =
                           ctx.
                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                           ._M_payload._M_value.span._M_str + 1;
                      bVar1 = true;
                    }
                    if (!bVar1) break;
                  }
                  local_38 = local_38 + 1;
                  goto LAB_00c009fd;
                }
              }
            }
          }
          local_40 = local_40 + (long)auStack_c8;
          ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._M_payload._M_value.span._M_str =
               ctx.
               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
               _M_payload.
               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
               _M_payload._M_value.span._M_str + (long)auStack_c8;
        } while( true );
      }
LAB_00c00bc1:
      sVar3 = next(this);
      anon_unknown_0::space
                ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_80,sVar3);
      if (ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._M_payload._8_1_ != '\x01') {
        return;
      }
      this->pos = this->pos + (long)local_80;
    }
    local_60 = DAT_01175f40;
    ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
    _16_8_ = srcAnnotationKind;
    sStack_58 = srcAnnotationKind;
    in_RCX = DAT_01175f40;
    anon_unknown_0::LexAnnotationCtx::startContents((LexAnnotationCtx *)local_80);
    _auStack_c8 = anon_unknown_0::LexCtx::next((LexCtx *)local_80);
    sStack_130 = std::basic_string_view<char,_std::char_traits<char>_>::find
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c8,'\n',0);
    if (sStack_130 == 0xffffffffffffffff) {
      sVar3 = anon_unknown_0::LexCtx::next((LexCtx *)local_80);
      sStack_130 = sVar3._M_len;
    }
    local_40 = local_40 + sStack_130;
LAB_00c008bb:
    ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
    _M_payload._M_value.span._M_str =
         ctx.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
         _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
         _M_payload._M_value.span._M_str + sStack_130;
LAB_00c00917:
    anon_unknown_0::LexCtx::lexed
              ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)auStack_120,
               (LexCtx *)local_80);
    if (basic.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
        _M_payload._8_1_ == '\0') goto LAB_00c00bc1;
    lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
    _M_payload._0_8_ =
         basic.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
         _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
         _M_payload._M_value.span._M_len;
    auStack_c8 = auStack_120;
    str = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     &ctx.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                      ._M_engaged,0,sStack_58);
    Name::Name((Name *)&lexed.
                        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                        ._M_payload._M_value.span._M_str,str);
    local_a8 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_50,0,local_40);
    basic.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
    _16_8_ = auStack_c8;
    local_f8.kind.super_IString.str._M_str =
         (char *)lexed.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                 _16_8_;
    local_f8.contents._M_len = local_a8._M_len;
    local_f8.contents._M_str = local_a8._M_str;
    local_d8 = 1;
    this->pos = this->pos + (long)auStack_c8;
    std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
    push_back(local_d0,&local_f8);
  } while( true );
}

Assistant:

void Lexer::skipSpace() {
  while (true) {
    if (auto ctx = annotation(next())) {
      pos += ctx->span.size();
      annotations.push_back(ctx->annotation);
      continue;
    }
    if (auto ctx = space(next())) {
      pos += ctx->span.size();
      continue;
    }
    break;
  }
}